

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

bool argagg::convert::parse_next_component<plus_triple>(char **s,plus_triple *out_arg,char delim)

{
  char *__s;
  char *pcVar1;
  undefined7 in_register_00000011;
  string arg_str;
  plus_triple local_58;
  char *local_40 [2];
  char local_30 [16];
  
  __s = *s;
  pcVar1 = strchr(__s,(int)CONCAT71(in_register_00000011,delim));
  *s = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_40,__s,(allocator *)&local_58);
    arg<plus_triple>(&local_58,local_40[0]);
    out_arg->z = local_58.z;
    out_arg->x = local_58.x;
    out_arg->y = local_58.y;
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,pcVar1);
    arg<plus_triple>(&local_58,local_40[0]);
    out_arg->z = local_58.z;
    out_arg->x = local_58.x;
    out_arg->y = local_58.y;
    *s = *s + 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parse_next_component(
    const char*& s,
    T& out_arg,
    const char delim)
  {
    const char* begin = s;
    s = std::strchr(s, delim);
    if (s == nullptr) {
      std::string arg_str(begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      return false;
    } else {
      std::string arg_str(begin, s - begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      s += 1;
      return true;
    }
  }